

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O2

bool FastPForLib::Simple16<false>::trymefull<1u,3u,4u,4u,3u,3u>(uint32_t *n)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  
  if (*n < 8) {
    lVar2 = 0;
    do {
      if (lVar2 == 4) {
        lVar2 = 0;
        do {
          bVar3 = lVar2 == 3;
          if (bVar3) {
            return bVar3;
          }
          lVar1 = lVar2 + 5;
          lVar2 = lVar2 + 1;
        } while (n[lVar1] < 8);
        return bVar3;
      }
      lVar1 = lVar2 + 1;
      lVar2 = lVar2 + 1;
    } while (n[lVar1] < 0x10);
  }
  return false;
}

Assistant:

__attribute__((pure)) static bool trymefull(const uint32_t *n) {
    const uint32_t min1 = num1;
    for (uint32_t i = 0; i < min1; i++) {
      if (n[i] >= (1U << log1))
        return false;
    }
    const uint32_t min2 = num2;

    for (uint32_t i = min1; i < min1 + min2; i++) {
      if (n[i] >= (1U << log2))
        return false;
    }
    const uint32_t min3 = num3;
    for (uint32_t i = min1 + min2; i < min1 + min2 + min3; i++) {
      if (n[i] >= (1U << log3))
        return false;
    }
    return true;
  }